

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

void __thiscall
burst::k_ary_search_set<int,_std::greater<void>_>::fill_counters
          (k_ary_search_set<int,_std::greater<void>_> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters)

{
  size_t sVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  uVar9 = branch->height - 1;
  uVar7 = this->m_arity;
  uVar5 = branch->height - 2;
  if (uVar5 == 0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 1;
    uVar8 = uVar7;
    do {
      uVar10 = uVar8;
      if ((uVar5 & 1) == 0) {
        uVar10 = 1;
      }
      lVar12 = lVar12 * uVar10;
      uVar8 = uVar8 * uVar8;
      bVar4 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar4);
    lVar12 = lVar12 + -1;
  }
  if (uVar9 == 0) {
    uVar5 = 0;
  }
  else {
    lVar11 = 1;
    uVar5 = uVar7;
    uVar8 = uVar9;
    do {
      uVar10 = uVar5;
      if ((uVar8 & 1) == 0) {
        uVar10 = 1;
      }
      lVar11 = lVar11 * uVar10;
      uVar5 = uVar5 * uVar5;
      bVar4 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar4);
    uVar5 = lVar11 - 1;
  }
  sVar1 = branch->size;
  if (uVar9 == 0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 1;
    uVar8 = uVar7;
    do {
      uVar10 = uVar8;
      if ((uVar9 & 1) == 0) {
        uVar10 = 1;
      }
      lVar11 = lVar11 * uVar10;
      uVar8 = uVar8 * uVar8;
      bVar4 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar4);
    lVar11 = 1 - lVar11;
  }
  uVar9 = sVar1 + 1;
  if (uVar9 < uVar7) {
    uVar7 = uVar9;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(counters,uVar7);
  puVar2 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar3 - (long)puVar2;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    uVar7 = lVar11 + lVar12 + sVar1;
    lVar11 = 0;
    uVar9 = uVar5;
    do {
      uVar8 = uVar7;
      if (uVar9 < uVar7) {
        uVar8 = uVar9;
      }
      puVar2[lVar11] = uVar8 + lVar11;
      lVar11 = lVar11 + 1;
      uVar9 = uVar9 + uVar5;
      uVar7 = uVar7 + lVar12;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
  }
  if (puVar3[-1] == branch->size) {
    return;
  }
  __assert_fail("counters.back() == branch.size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x197,
                "void burst::k_ary_search_set<int, std::greater<void>>::fill_counters(const k_ary_search_set_branch &, std::vector<std::size_t> &) [Value = int, Compare = std::greater<void>]"
               );
}

Assistant:

void
            fill_counters
            (
                const k_ary_search_set_branch & branch,
                std::vector<std::size_t> & counters
            )
        {
            const std::size_t max_subtree_height = branch.height - 1;
            const std::size_t min_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height - 1);
            const std::size_t max_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height);
            const std::size_t elements_in_last_row =
                branch.size - perfect_tree_size(m_arity, branch.height - 1);

            counters.resize(std::min(m_arity, branch.size + 1));
            for (std::size_t i = 0; i < counters.size(); ++i)
            {
                counters[i] = i + std::min
                (
                    (i + 1) * min_subtree_elements + elements_in_last_row,
                    (i + 1) * max_subtree_elements
                );
            }
            BOOST_ASSERT(counters.back() == branch.size);
        }